

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_memory
               (uchar **out,uint *w,uint *h,uchar *in,size_t insize,LodePNGColorType colortype,
               uint bitdepth)

{
  uint uVar1;
  LodePNGState state;
  uint error;
  size_t in_stack_fffffffffffffdc0;
  uchar *in_stack_fffffffffffffdc8;
  LodePNGState *in_stack_fffffffffffffdd0;
  uint *in_stack_fffffffffffffdd8;
  uint *in_stack_fffffffffffffde0;
  uchar **in_stack_fffffffffffffde8;
  
  lodepng_state_init((LodePNGState *)0x65c298);
  uVar1 = lodepng_decode(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                         in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  lodepng_state_cleanup((LodePNGState *)0x65c307);
  return uVar1;
}

Assistant:

unsigned lodepng_decode_memory(unsigned char** out, unsigned* w, unsigned* h, const unsigned char* in,
                               size_t insize, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  /*disable reading things that this function doesn't output*/
  state.decoder.read_text_chunks = 0;
  state.decoder.remember_unknown_chunks = 0;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  error = lodepng_decode(out, w, h, &state, in, insize);
  lodepng_state_cleanup(&state);
  return error;
}